

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O1

int __thiscall iDynTree::Visualizer::close(Visualizer *this,int __fd)

{
  int in_EAX;
  
  return in_EAX;
}

Assistant:

void Visualizer::close()
{
#ifdef IDYNTREE_USES_IRRLICHT
    if( !pimpl->m_isInitialized )
    {
        return;
    }
#ifdef IDYNTREE_USE_GLFW_WINDOW
    glfwMakeContextCurrent(pimpl->m_window);
#endif

    pimpl->m_vectors.close();
    pimpl->m_frames.close();
    pimpl->m_environment.close();

    pimpl->m_irrDevice->closeDevice();
    pimpl->m_irrDevice->drop();
    pimpl->m_irrDevice = nullptr;
    pimpl->m_isInitialized = false;

    for(size_t mdl=0; mdl < pimpl->m_modelViz->size(); mdl++)
    {
        if( pimpl->m_modelViz->at(mdl))
        {
            delete pimpl->m_modelViz->at(mdl);
            pimpl->m_modelViz->at(mdl) = nullptr;
        }
    }

    pimpl->m_modelViz->resize(0);

#ifdef IDYNTREE_USE_GLFW_WINDOW
    if (pimpl->m_window)
    {
        glfwMakeContextCurrent(pimpl->m_window);
        glfwDestroyWindow(pimpl->m_window);

        pimpl->m_glfwInstances--;
        if (pimpl->m_glfwInstances == 0)
        {
            glfwTerminate();
        }

        pimpl->m_window = nullptr;
    }
#endif

    return;
#endif
}